

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_equals(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  uint uVar3;
  byte *pbVar4;
  undefined1 uVar5;
  byte bVar6;
  ulong uVar7;
  byte bVar8;
  long *plVar9;
  int i;
  ulong uVar10;
  
  uVar3 = (r1->high_low_container).size;
  uVar10 = 0;
  if (uVar3 == (r2->high_low_container).size) {
    uVar7 = 0;
    if (0 < (int)uVar3) {
      uVar7 = (ulong)uVar3;
    }
    do {
      if (uVar7 == uVar10) {
        uVar10 = (ulong)((int)uVar3 < 1);
        if (0 < (int)uVar3) {
          bVar6 = *(r1->high_low_container).typecodes;
          if (bVar6 == 4) {
            bVar6 = *(byte *)((long)*(r1->high_low_container).containers + 8);
          }
          pbVar4 = (r2->high_low_container).typecodes;
          plVar9 = (long *)*(r2->high_low_container).containers;
          bVar8 = *pbVar4;
          if (bVar8 == 4) {
            bVar8 = *(byte *)(plVar9 + 1);
            plVar9 = (long *)*plVar9;
          }
          uVar5 = (*(code *)(&DAT_0011b2f8 +
                            *(int *)(&DAT_0011b2f8 +
                                    (ulong)(((uint)bVar8 + (uint)bVar6 * 4) - 5) * 4)))
                            (pbVar4,plVar9,bVar8,
                             &DAT_0011b2f8 +
                             *(int *)(&DAT_0011b2f8 +
                                     (ulong)(((uint)bVar8 + (uint)bVar6 * 4) - 5) * 4));
          return (_Bool)uVar5;
        }
        goto LAB_0010697e;
      }
      puVar1 = (r1->high_low_container).keys + uVar10;
      puVar2 = (r2->high_low_container).keys + uVar10;
      uVar10 = uVar10 + 1;
    } while (*puVar1 == *puVar2);
    uVar10 = 0;
  }
LAB_0010697e:
  return SUB81(uVar10,0);
}

Assistant:

bool roaring_bitmap_equals(const roaring_bitmap_t *r1,
                           const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    if (ra1->size != ra2->size) {
        return false;
    }
    for (int i = 0; i < ra1->size; ++i) {
        if (ra1->keys[i] != ra2->keys[i]) {
            return false;
        }
    }
    for (int i = 0; i < ra1->size; ++i) {
        bool areequal = container_equals(ra1->containers[i], ra1->typecodes[i],
                                         ra2->containers[i], ra2->typecodes[i]);
        if (!areequal) {
            return false;
        }
    }
    return true;
}